

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.c
# Opt level: O0

bool_t prf_texture_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  ushort uVar1;
  ushort *in_RDI;
  bfile_t *unaff_retaddr;
  node_data_conflict11 *data;
  int pos;
  int32_t in_stack_ffffffffffffffcc;
  bfile_t *in_stack_ffffffffffffffd0;
  bfile_t *bfile_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  bool_t bVar2;
  
  if (*in_RDI == prf_texture_info.opcode) {
    bf_put_uint16_be(in_stack_ffffffffffffffd0,(uint16_t)((uint)in_stack_ffffffffffffffcc >> 0x10));
    bf_put_uint16_be(in_stack_ffffffffffffffd0,(uint16_t)((uint)in_stack_ffffffffffffffcc >> 0x10));
    uVar1 = 4;
    bfile_00 = *(bfile_t **)(in_RDI + 4);
    if (0xcb < in_RDI[1]) {
      bf_write(unaff_retaddr,
               (uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
               (uint)((ulong)in_RDI >> 0x20));
      uVar1 = 0xcc;
      if (0xcf < in_RDI[1]) {
        bf_put_int32_be(bfile_00,in_stack_ffffffffffffffcc);
        uVar1 = 0xd0;
        if (0xd3 < in_RDI[1]) {
          bf_put_int32_be(bfile_00,in_stack_ffffffffffffffcc);
          uVar1 = 0xd4;
          if (0xd7 < in_RDI[1]) {
            bf_put_int32_be(bfile_00,in_stack_ffffffffffffffcc);
            uVar1 = 0xd8;
          }
        }
      }
    }
    if (uVar1 < in_RDI[1]) {
      bf_write(unaff_retaddr,
               (uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
               (uint)((ulong)in_RDI >> 0x20));
    }
    bVar2 = 1;
  }
  else {
    prf_error(9,"tried using texture save method for node of type %d.",(ulong)*in_RDI);
    bVar2 = 0;
  }
  return bVar2;
}

Assistant:

static
bool_t
prf_texture_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_texture_info.opcode ) {
        prf_error( 9, "tried using texture save method for node of type %d.",
                   node->opcode);
        return FALSE;
    }
    
    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    pos = 4;
    do {
        node_data * data;
        data = (node_data *) node->data;

        if ( node->length < (pos + 200) ) break;
        bf_write( bfile, (unsigned char *) data->filename, 200 ); pos += 200;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->pattern_index ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->x_location ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->y_location ); pos += 4;
    } while ( FALSE );

    if ( node->length > pos )
        pos += bf_write( bfile, node->data + pos - 4 + NODE_DATA_PAD,
                         node->length - pos);
  
    return TRUE;
}